

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O3

void delete_data_dictionary(coda_data_dictionary *data_dictionary)

{
  coda_product_class **__ptr;
  long lVar1;
  
  if (data_dictionary->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(data_dictionary->hash_data);
  }
  __ptr = data_dictionary->product_class;
  if (__ptr != (coda_product_class **)0x0) {
    if (0 < data_dictionary->num_product_classes) {
      lVar1 = 0;
      do {
        coda_product_class_delete(data_dictionary->product_class[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < data_dictionary->num_product_classes);
      __ptr = data_dictionary->product_class;
    }
    free(__ptr);
  }
  lVar1 = 3;
  do {
    if (data_dictionary->detection_tree[lVar1 + -3] != (coda_detection_node *)0x0) {
      coda_detection_tree_delete(data_dictionary->detection_tree[lVar1 + -3]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0xd);
  free(data_dictionary);
  return;
}

Assistant:

static void delete_data_dictionary(coda_data_dictionary *data_dictionary)
{
    int i;

    assert(data_dictionary != NULL);
    if (data_dictionary->hash_data != NULL)
    {
        hashtable_delete(data_dictionary->hash_data);
    }
    if (data_dictionary->product_class != NULL)
    {
        for (i = 0; i < data_dictionary->num_product_classes; i++)
        {
            coda_product_class_delete(data_dictionary->product_class[i]);
        }
        free(data_dictionary->product_class);
    }
    for (i = 0; i < CODA_NUM_FORMATS; i++)
    {
        if (data_dictionary->detection_tree[i] != NULL)
        {
            coda_detection_tree_delete(data_dictionary->detection_tree[i]);
        }
    }

    free(data_dictionary);
}